

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  allocator local_e9;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  location local_88;
  allocator local_49;
  string local_48 [32];
  text *local_28;
  text *decomposition__local;
  text *expr__local;
  location *where__local;
  failure *this_local;
  
  local_28 = decomposition_;
  decomposition__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"failed",&local_49);
  location::location(&local_88,where_);
  std::operator+(local_c8,(char *)expr_);
  std::operator+(local_a8,local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",&local_e9);
  message::message(&this->super_message,(text *)local_48,&local_88,local_a8,(text *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_c8);
  location::~location(&local_88);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *(undefined ***)&this->super_message = &PTR__failure_0011fc90;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message{ "failed", where_, expr_ + " for " + decomposition_ } {}